

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_witness_program_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  _Bool _Var1;
  uchar *p;
  int ret;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((bytes_len == 0) || (bytes != (uchar *)0x0)) && (_Var1 = script_flags_ok(flags,4), _Var1))
      && ((bytes_out != (uchar *)0x0 && (len != 0)))) && (written != (size_t *)0x0)) {
    if ((flags & 3) == 0) {
      if ((bytes_len != 0x14) && (bytes_len != 0x20)) {
        return -2;
      }
    }
    else if (bytes_len == 0) {
      return -2;
    }
    written_local = (size_t *)len;
    len_local = (size_t)bytes_out;
    if ((flags & 4) != 0) {
      if (len < 2) {
        return -2;
      }
      len_local = (size_t)(bytes_out + 1);
      written_local = (size_t *)(len - 1);
    }
    *(undefined1 *)len_local = 0;
    bytes_local._4_4_ =
         wally_script_push_from_bytes
                   (bytes,bytes_len,flags & 0xfffffffb,(uchar *)(len_local + 1),
                    (long)written_local - 1,written);
    if ((bytes_local._4_4_ == 0) && (*written = *written + 1, (flags & 4) != 0)) {
      *bytes_out = (uchar)*written;
      *written = *written + 1;
    }
  }
  else {
    bytes_local._4_4_ = -2;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_witness_program_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                     uint32_t flags,
                                     unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) ||
        !script_flags_ok(flags, WALLY_SCRIPT_AS_PUSH) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & ALL_SCRIPT_HASH_FLAGS) {
        if (!bytes_len)
            return WALLY_EINVAL;
    } else if (bytes_len != HASH160_LEN && bytes_len != SHA256_LEN) {
        /* Only v0 witness scripts are currently supported */
        return WALLY_EINVAL;
    }
    if (flags & WALLY_SCRIPT_AS_PUSH) {
        if (len < 2)
            return WALLY_EINVAL;
        ++bytes_out;
        --len;
    }

    bytes_out[0] = 0; /* Witness version */
    ret = wally_script_push_from_bytes(bytes, bytes_len,
                                       flags & ~WALLY_SCRIPT_AS_PUSH,
                                       bytes_out + 1, len - 1, written);
    if (ret == WALLY_OK) {
        *written += 1; /* For Witness version byte */
        if (flags & WALLY_SCRIPT_AS_PUSH) {
            *p = *written & 0xff;
            *written += 1; /* For Witness version byte */
        }
    }
    return ret;
}